

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

RangeStaticLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::RangeStaticLayerParams>
          (Arena *arena)

{
  RangeStaticLayerParams *pRVar1;
  
  if (arena != (Arena *)0x0) {
    pRVar1 = DoCreateMessage<CoreML::Specification::RangeStaticLayerParams>(arena);
    return pRVar1;
  }
  pRVar1 = (RangeStaticLayerParams *)operator_new(0x20);
  CoreML::Specification::RangeStaticLayerParams::RangeStaticLayerParams(pRVar1,(Arena *)0x0,false);
  return pRVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }